

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O1

void InsertNode(void)

{
  uint *puVar1;
  UINT8 *pUVar2;
  UINT8 *pUVar3;
  byte bVar4;
  UINT8 *pUVar5;
  NODE_conflict *pNVar6;
  NODE_conflict *pNVar7;
  NODE_conflict *pNVar8;
  NODE_conflict *pNVar9;
  NODE_conflict *pNVar10;
  INT32 IVar11;
  NODE_conflict NVar12;
  NODE_conflict NVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  byte *pbVar20;
  NODE_conflict Node1;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  
  NVar12 = mPos;
  pNVar9 = mNext;
  pNVar7 = mParent;
  pNVar6 = mPosition;
  if (mMatchLen < 4) {
    lVar24 = (long)mPos;
    uVar17 = (ulong)mText[lVar24] + 0x80000;
    uVar21 = (uint)mText[lVar24] + (uint)mText[lVar24 + 1] * 0x400 + 0x180000;
    uVar14 = mNext[uVar21];
    iVar16 = (int)uVar17;
    *mParent = iVar16;
    while( true ) {
      uVar23 = (ulong)uVar14;
      if (pNVar7[(int)uVar14] == iVar16) break;
      uVar14 = pNVar9[(int)uVar14];
    }
    if (uVar14 == 0) {
      iVar22 = pNVar9[uVar21];
      pNVar9[uVar21] = NVar12;
      pNVar9[lVar24] = iVar22;
      pNVar6 = mPrev;
      mPrev[iVar22] = NVar12;
      pNVar6[lVar24] = uVar21;
      pNVar7[lVar24] = iVar16;
      mChildCount[uVar17] = mChildCount[uVar17] + '\x01';
      mMatchLen = 1;
      return;
    }
    mMatchLen = 2;
  }
  else {
    mMatchLen = mMatchLen + -1;
    uVar23 = (long)mMatchPos + 1U | 0x80000;
    uVar14 = mParent[uVar23];
    while (uVar14 == 0) {
      uVar23 = (ulong)mNext[(int)uVar23];
      uVar14 = mParent[uVar23];
    }
    lVar24 = (long)(int)uVar14;
    bVar4 = mLevel[lVar24];
    while (mMatchLen <= (int)(uint)bVar4) {
      puVar1 = (uint *)(mParent + lVar24);
      lVar24 = (long)(int)*puVar1;
      uVar23 = (ulong)uVar14;
      uVar14 = *puVar1;
      bVar4 = mLevel[lVar24];
    }
    uVar17 = (ulong)uVar14;
    lVar24 = (long)(int)uVar14;
    iVar16 = mPosition[lVar24];
    while (iVar16 < 0) {
      pNVar6[lVar24] = NVar12;
      uVar14 = pNVar7[lVar24];
      lVar24 = (long)(int)uVar14;
      iVar16 = pNVar6[lVar24];
    }
    if ((int)uVar14 < 0x80000) {
      pNVar6[lVar24] = mPos | 0x80000000;
    }
  }
  NVar12 = mPos;
  pNVar9 = mNext;
  pNVar7 = mParent;
  pNVar6 = mPosition;
  pUVar2 = mLevel;
  pUVar5 = mText;
  lVar24 = (long)mPos;
  while( true ) {
    NVar13 = mAvail;
    IVar11 = mMatchLen;
    pNVar10 = mNext;
    pNVar8 = mPrev;
    pUVar3 = mChildCount;
    uVar21 = (uint)uVar23;
    uVar25 = uVar23 & 0xffffffff;
    uVar27 = 0x100;
    uVar14 = uVar21;
    if ((int)uVar21 < 0x80000) {
      uVar27 = (uint)pUVar2[(int)uVar21];
      uVar14 = pNVar6[(int)uVar21] & 0x7fffffff;
    }
    uVar26 = uVar14 - 0x80000;
    if ((int)uVar14 < NVar12) {
      uVar26 = uVar14;
    }
    pbVar20 = pUVar5 + (mMatchLen + NVar12);
    uVar14 = mMatchLen;
    mMatchPos = uVar26;
    if (mMatchLen < (int)uVar27) {
      iVar16 = uVar26 + mMatchLen;
      iVar22 = mMatchLen - uVar27;
      lVar15 = 0;
      do {
        if (pbVar20[lVar15] != pUVar5[lVar15 + iVar16]) {
          lVar18 = (long)mAvail;
          mAvail = mNext[lVar18];
          mChildCount[lVar18] = '\0';
          pNVar7 = mPrev;
          iVar16 = mPrev[(int)uVar21];
          mPrev[lVar18] = iVar16;
          pNVar10[iVar16] = NVar13;
          iVar16 = pNVar10[(int)uVar21];
          pNVar10[lVar18] = iVar16;
          pNVar7[iVar16] = NVar13;
          pNVar6 = mParent;
          mParent[lVar18] = mParent[(int)uVar21];
          iVar19 = IVar11 + (int)lVar15;
          mLevel[lVar18] = (UINT8)iVar19;
          mPosition[lVar18] = NVar12;
          iVar22 = (uint)pUVar5[(int)(uVar26 + iVar19)] * 0x400 + NVar13 + 0x100000;
          iVar16 = pNVar10[iVar22];
          pNVar10[iVar22] = uVar21;
          pNVar10[(int)uVar21] = iVar16;
          pNVar7[iVar16] = uVar21;
          pNVar7[(int)uVar21] = iVar22;
          pNVar6[(int)uVar21] = NVar13;
          pUVar2 = pUVar3 + lVar18;
          *pUVar2 = *pUVar2 + '\x01';
          iVar22 = (uint)pUVar5[iVar19 + NVar12] * 0x400 + NVar13 + 0x100000;
          iVar16 = pNVar10[iVar22];
          pNVar10[iVar22] = NVar12;
          pNVar10[lVar24] = iVar16;
          pNVar7[iVar16] = NVar12;
          pNVar7[lVar24] = iVar22;
          pNVar6[lVar24] = NVar13;
          pUVar3 = pUVar3 + lVar18;
          *pUVar3 = *pUVar3 + '\x01';
          return;
        }
        mMatchLen = IVar11 + (int)lVar15 + 1;
        lVar15 = lVar15 + 1;
      } while (iVar22 + (int)lVar15 != 0);
      pbVar20 = pbVar20 + lVar15;
      uVar14 = uVar27;
    }
    if (0xff < (int)uVar14) break;
    pNVar6[(int)uVar21] = NVar12;
    uVar27 = pNVar9[(uint)*pbVar20 * 0x400 + uVar21 + 0x100000];
    *pNVar7 = uVar21;
    lVar15 = (long)(int)uVar27;
    uVar26 = pNVar7[lVar15];
    while (uVar26 != uVar21) {
      uVar27 = pNVar9[lVar15];
      lVar15 = (long)(int)uVar27;
      uVar26 = pNVar7[lVar15];
    }
    uVar23 = (ulong)uVar27;
    if (uVar27 == 0) {
      iVar22 = (uint)*pbVar20 * 0x400 + uVar21 + 0x100000;
      iVar16 = pNVar9[iVar22];
      pNVar9[iVar22] = NVar12;
      pNVar9[lVar24] = iVar16;
      pNVar6 = mPrev;
      mPrev[iVar16] = NVar12;
      pNVar6[lVar24] = iVar22;
      pNVar7[lVar24] = uVar21;
      mChildCount[(int)uVar21] = mChildCount[(int)uVar21] + '\x01';
      return;
    }
    mMatchLen = uVar14 + 1;
    uVar17 = uVar25;
  }
  iVar16 = mPrev[(int)uVar21];
  mPrev[lVar24] = iVar16;
  pNVar7 = mNext;
  mNext[iVar16] = NVar12;
  iVar16 = pNVar7[(int)uVar21];
  pNVar7[lVar24] = iVar16;
  pNVar8[iVar16] = NVar12;
  pNVar6 = mParent;
  mParent[lVar24] = (NODE_conflict)uVar17;
  pNVar6[(int)uVar21] = 0;
  pNVar7[(int)uVar21] = NVar12;
  return;
}

Assistant:

STATIC
  VOID
  InsertNode (
  VOID
  )
  /*++

  Routine Description:

  Insert string info for current position into the String Info Log

  Arguments: (VOID)

  Returns: (VOID)

  --*/
{
  NODE  NodeQ;
  NODE  NodeR;
  NODE  Index2;
  NODE  NodeT;
  UINT8 CharC;
  UINT8 *t1;
  UINT8 *t2;

  if (mMatchLen >= 4) {
    //
    // We have just got a long match, the target tree
    // can be located by MatchPos + 1. Traverse the tree
    // from bottom up to get to a proper starting point.
    // The usage of PERC_FLAG ensures proper node deletion
    // DeleteNode() later.
    //
    mMatchLen--;
    NodeR = (NODE) ((mMatchPos + 1) | WNDSIZ);
    NodeQ = mParent[NodeR];
    while (NodeQ == NIL) {
      NodeR = mNext[NodeR];
      NodeQ = mParent[NodeR];
    }

    while (mLevel[NodeQ] >= mMatchLen) {
      NodeR = NodeQ;
      NodeQ = mParent[NodeQ];
    }

    NodeT = NodeQ;
    while (mPosition[NodeT] < 0) {
      mPosition[NodeT]  = mPos;
      NodeT             = mParent[NodeT];
    }

        if (NodeT < (NODE) WNDSIZ) {
      mPosition[NodeT] = (NODE) (mPos | (UINT32) PERC_FLAG);
    }
  } else {
    //
    // Locate the target tree
    //
    NodeQ = (NODE) (mText[mPos] + WNDSIZ);
    CharC = mText[mPos + 1];
    NodeR = Child (NodeQ, CharC);
    if (NodeR == NIL) {
      MakeChild (NodeQ, CharC, mPos);
      mMatchLen = 1;
      return ;
    }

    mMatchLen = 2;
  }
  //
  // Traverse down the tree to find a match.
  // Update Position value along the route.
  // Node split or creation is involved.
  //
  for (;;) {
        if (NodeR >= (NODE) WNDSIZ) {
      Index2    = MAXMATCH;
      mMatchPos = NodeR;
    } else {
      Index2    = mLevel[NodeR];
      mMatchPos = (NODE) (mPosition[NodeR] & (UINT32)~PERC_FLAG);
    }

    if (mMatchPos >= mPos) {
      mMatchPos -= WNDSIZ;
    }

    t1  = &mText[mPos + mMatchLen];
    t2  = &mText[mMatchPos + mMatchLen];
    while (mMatchLen < Index2) {
      if (*t1 != *t2) {
        Split (NodeR);
        return ;
      }

      mMatchLen++;
      t1++;
      t2++;
    }

    if (mMatchLen >= MAXMATCH) {
      break;
    }

    mPosition[NodeR]  = mPos;
    NodeQ             = NodeR;
    NodeR             = Child (NodeQ, *t1);
    if (NodeR == NIL) {
      MakeChild (NodeQ, *t1, mPos);
      return ;
    }

    mMatchLen++;
  }

  NodeT           = mPrev[NodeR];
  mPrev[mPos]     = NodeT;
  mNext[NodeT]    = mPos;
  NodeT           = mNext[NodeR];
  mNext[mPos]     = NodeT;
  mPrev[NodeT]    = mPos;
  mParent[mPos]   = NodeQ;
  mParent[NodeR]  = NIL;

  //
  // Special usage of 'next'
  //
  mNext[NodeR] = mPos;

}